

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  pointer ptr;
  pointer phVar1;
  pointer ptr_00;
  array_storage *storage;
  
  switch((byte)(this->field_0).json_const_pointer_ & 0xf) {
  case 0xc:
    ptr = (pointer)(this->field_0).long_str_.ptr_;
    if (ptr != (pointer)0x0) {
      utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::destroy
                (ptr);
      return;
    }
    break;
  case 0xd:
    phVar1 = (this->field_0).long_str_.ptr_;
    if (phVar1 != (pointer)0x0) {
      sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
      ::~sorted_json_object
                ((sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                  *)phVar1);
LAB_00232cfc:
      operator_delete((this->field_0).long_str_.ptr_,0x20);
      return;
    }
    break;
  case 0xe:
    phVar1 = (this->field_0).long_str_.ptr_;
    if (phVar1 != (pointer)0x0) {
      json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
      ::~json_array((json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                     *)phVar1);
      goto LAB_00232cfc;
    }
    break;
  case 0xf:
    ptr_00 = (this->field_0).long_str_.ptr_;
    if (ptr_00 != (pointer)0x0) {
      utility::heap_string_factory<wchar_t,_jsoncons::null_type,_std::allocator<char>_>::destroy
                (ptr_00);
      return;
    }
  }
  return;
}

Assistant:

void destroy()
        {
            switch (storage_kind())
            {
                case json_storage_kind::long_str:
                {
                    if (cast<long_string_storage>().ptr_ != nullptr)
                    {
                        long_string_storage::heap_string_factory_type::destroy(cast<long_string_storage>().ptr_);
                    }
                    break;
                }
                case json_storage_kind::byte_str:
                    if (cast<byte_string_storage>().ptr_ != nullptr)
                    {
                        byte_string_storage::heap_string_factory_type::destroy(cast<byte_string_storage>().ptr_);
                    }
                    break;
                case json_storage_kind::array:
                {
                    if (cast<array_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<array_storage>();
                        typename array_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename array_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename array_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                case json_storage_kind::object:
                {
                    if (cast<object_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<object_storage>();
                        typename object_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename object_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename object_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                default:
                    break;
            }
        }